

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  undefined1 local_88 [8];
  Sample_t<kiste::terminal_t,_Data,_kiste::raw> sample;
  raw serializer;
  ostream *os;
  allocator<int> local_49;
  int local_48 [6];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  Data data;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_48[4] = 5;
  local_48[5] = 6;
  local_30 = local_48;
  local_28 = 6;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  kiste::raw::raw((raw *)&sample._serialize,(ostream *)&std::cout);
  test::Sample_generator::operator()
            ((Sample_t<kiste::terminal_t,_Data,_kiste::raw> *)local_88,
             (Sample_generator *)&test::Sample,(Data *)local_20,(raw *)&sample._serialize);
  test::Sample_t<kiste::terminal_t,_Data,_kiste::raw>::render
            ((Sample_t<kiste::terminal_t,_Data,_kiste::raw> *)local_88);
  Data::~Data((Data *)local_20);
  return 0;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = kiste::raw{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
}